

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void panic(char *str,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar1;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *local_1f8;
  undefined1 local_1e8 [8];
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined4 local_138;
  undefined4 local_134;
  va_list the_args;
  char local_118 [8];
  char buf [256];
  char *str_local;
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  the_args[0].overflow_arg_area = local_1e8;
  the_args[0]._0_8_ = &stack0x00000008;
  local_134 = 0x30;
  local_138 = 8;
  local_1e0 = in_RSI;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  if (program_state.panicking == 0) {
    if (program_state.gameover == 0) {
      local_1f8 = "Suddenly, the dungeon collapses.\n";
      if (program_state.something_worth_saving == 0) {
        local_1f8 = "Program initialization has failed.\n";
      }
    }
    else {
      local_1f8 = "Postgame wrapup disrupted.\n";
    }
    program_state.panicking = program_state.panicking + 1;
    (*windowprocs.win_raw_print)(local_1f8);
    if (flags.debug == '\0') {
      pcVar1 = " and it may be possible to rebuild.";
      if (program_state.something_worth_saving == 0) {
        pcVar1 = "";
      }
      raw_printf("Report error to \"%s\"%s.\n","daniel",pcVar1);
    }
    if (program_state.something_worth_saving != 0) {
      dosave0('\x01');
    }
    vsprintf(local_118,str,&local_138);
    (*windowprocs.win_raw_print)(local_118);
    paniclog("panic",local_118);
    done(0xc);
    return;
  }
  program_state.panicking = program_state.panicking + 1;
  terminate();
}

Assistant:

void panic(const char *str, ...)
{
	char buf[BUFSZ];
	va_list the_args;
	va_start(the_args, str);

	if (program_state.panicking++)
	    terminate(); /* avoid loops - this should never happen*/

	raw_print(program_state.gameover ?
		  "Postgame wrapup disrupted.\n" :
		  !program_state.something_worth_saving ?
		  "Program initialization has failed.\n" :
		  "Suddenly, the dungeon collapses.\n");
	if (!wizard)
	    raw_printf("Report error to \"%s\"%s.\n", WIZARD,
			!program_state.something_worth_saving ? "" :
			" and it may be possible to rebuild.");
	if (program_state.something_worth_saving)
	    dosave0(TRUE);
	
	vsprintf(buf,str,the_args);
	raw_print(buf);
	paniclog("panic", buf);

	va_end(the_args);
	done(PANICKED);
}